

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O3

void __thiscall
glcts::FramebufferNoAttachmentsApiCase::begin_fbo
          (FramebufferNoAttachmentsApiCase *this,GLenum target,uint test_case)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  
  if (test_case == 1) {
    iVar1 = (*((this->super_FramebufferNoAttachmentsBaseCase).super_TestCase.m_context)->m_renderCtx
              ->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var_00,iVar1);
    (**(code **)(lVar2 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar2 + 0x78))(target,this->m_fbo);
    (**(code **)(lVar2 + 0x6e8))(1,&this->m_renderbuffer);
    (**(code **)(lVar2 + 0xa0))(0x8d41,this->m_renderbuffer);
    (**(code **)(lVar2 + 0x1240))(0x8d41,4,0x8058,0x65,0x66);
    (**(code **)(lVar2 + 0x688))(target,0x8ce0,0x8d41,this->m_renderbuffer);
    FramebufferNoAttachmentsBaseCase::expect_fbo_status
              (&this->super_FramebufferNoAttachmentsBaseCase,target,0x8cd5,
               "framebuffer with an attachment should be complete");
    return;
  }
  if (test_case != 0) {
    return;
  }
  iVar1 = (*((this->super_FramebufferNoAttachmentsBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6d0))(1,&this->m_fbo);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x78))(target,this->m_fbo);
  FramebufferNoAttachmentsBaseCase::expect_fbo_status
            (&this->super_FramebufferNoAttachmentsBaseCase,target,0x8cd7,
             "error setting up framebuffer with multisample attachment");
  return;
}

Assistant:

void FramebufferNoAttachmentsApiCase::begin_fbo(GLenum target, unsigned test_case)
{
	switch (test_case)
	{
	case 0:
		begin_fbo_no_attachments(target);
		break;
	case 1:
		begin_fbo_with_multisample_renderbuffer(target);
		break;
	}
}